

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac__seek_to_pcm_frame__binary_search_internal
                    (ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex,ma_uint64 byteRangeLo,
                    ma_uint64 byteRangeHi)

{
  ushort uVar1;
  ma_bool32 mVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  float fVar6;
  ma_uint64 local_48;
  ma_uint64 lastSuccessfulSeekOffset;
  ulong local_38;
  
  lastSuccessfulSeekOffset = 0xffffffffffffffff;
  uVar1 = pFlac->maxBlockSizeInPCMFrames;
  local_38 = 0x1000;
  if (uVar1 != 0) {
    local_38 = (ulong)((uint)uVar1 + (uint)uVar1);
  }
  fVar6 = (float)(long)((ulong)pFlac->bitsPerSample * (ulong)pFlac->channels *
                       (pcmFrameIndex - pFlac->currentPCMFrame)) * 0.125 * 0.6;
  uVar3 = (ulong)fVar6;
  uVar3 = ((long)(fVar6 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3) + byteRangeLo;
  if (byteRangeHi <= uVar3) {
    uVar3 = byteRangeHi;
  }
  uVar5 = pFlac->totalPCMFrameCount;
  local_48 = byteRangeLo;
  do {
    mVar2 = ma_dr_flac__seek_to_approximate_flac_frame_to_byte
                      (pFlac,uVar3,byteRangeLo,byteRangeHi,&lastSuccessfulSeekOffset);
    if (mVar2 == 0) {
LAB_00184fde:
      ma_dr_flac__seek_to_first_frame(pFlac);
      return 0;
    }
    uVar3 = (pFlac->currentFLACFrame).header.pcmFrameNumber;
    if (uVar3 == 0) {
      uVar3 = (ulong)pFlac->maxBlockSizeInPCMFrames *
              (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
    }
    if (uVar5 == uVar3) {
      mVar2 = ma_dr_flac__seek_to_approximate_flac_frame_to_byte
                        (pFlac,local_48,local_48,byteRangeHi,&lastSuccessfulSeekOffset);
      if (mVar2 != 0) {
LAB_00184fc3:
        mVar2 = ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames
                          (pFlac,pcmFrameIndex - pFlac->currentPCMFrame);
        if (mVar2 != 0) {
          return 1;
        }
      }
      goto LAB_00184fde;
    }
    lVar4 = (pFlac->currentFLACFrame).header.blockSizeInPCMFrames + uVar3;
    uVar5 = lVar4 - 1;
    if (lVar4 == 0) {
      uVar5 = 0;
    }
    if ((uVar3 <= pcmFrameIndex) && (pcmFrameIndex <= uVar5)) goto LAB_00184fc3;
    uVar5 = uVar3;
    if (pcmFrameIndex < uVar3) {
      if (lastSuccessfulSeekOffset <= byteRangeLo) {
        byteRangeLo = lastSuccessfulSeekOffset;
      }
      uVar3 = (lastSuccessfulSeekOffset - byteRangeLo >> 1) + byteRangeLo;
      byteRangeHi = lastSuccessfulSeekOffset;
      if (uVar3 <= byteRangeLo) {
        uVar3 = byteRangeLo;
      }
    }
    else {
      lVar4 = (ulong)pFlac->bitsPerSample * (ulong)pFlac->channels;
      if (pcmFrameIndex - uVar3 < local_38) goto LAB_00184fc3;
      if (byteRangeHi <= lastSuccessfulSeekOffset) {
        byteRangeHi = lastSuccessfulSeekOffset;
      }
      fVar6 = (float)(long)(lVar4 * (pcmFrameIndex - uVar3)) * 0.125 *
              ((float)(long)(lastSuccessfulSeekOffset - pFlac->firstFLACFramePosInBytes) /
              ((float)(long)(lVar4 * uVar3) * 0.125));
      uVar3 = (ulong)fVar6;
      uVar3 = ((long)(fVar6 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3) +
              lastSuccessfulSeekOffset;
      if (byteRangeHi <= uVar3) {
        uVar3 = byteRangeHi;
      }
      byteRangeLo = lastSuccessfulSeekOffset;
      if (local_48 <= lastSuccessfulSeekOffset) {
        local_48 = lastSuccessfulSeekOffset;
      }
    }
  } while( true );
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_pcm_frame__binary_search_internal(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex, ma_uint64 byteRangeLo, ma_uint64 byteRangeHi)
{
    ma_uint64 targetByte;
    ma_uint64 pcmRangeLo = pFlac->totalPCMFrameCount;
    ma_uint64 pcmRangeHi = 0;
    ma_uint64 lastSuccessfulSeekOffset = (ma_uint64)-1;
    ma_uint64 closestSeekOffsetBeforeTargetPCMFrame = byteRangeLo;
    ma_uint32 seekForwardThreshold = (pFlac->maxBlockSizeInPCMFrames != 0) ? pFlac->maxBlockSizeInPCMFrames*2 : 4096;
    targetByte = byteRangeLo + (ma_uint64)(((ma_int64)((pcmFrameIndex - pFlac->currentPCMFrame) * pFlac->channels * pFlac->bitsPerSample)/8.0f) * MA_DR_FLAC_BINARY_SEARCH_APPROX_COMPRESSION_RATIO);
    if (targetByte > byteRangeHi) {
        targetByte = byteRangeHi;
    }
    for (;;) {
        if (ma_dr_flac__seek_to_approximate_flac_frame_to_byte(pFlac, targetByte, byteRangeLo, byteRangeHi, &lastSuccessfulSeekOffset)) {
            ma_uint64 newPCMRangeLo;
            ma_uint64 newPCMRangeHi;
            ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &newPCMRangeLo, &newPCMRangeHi);
            if (pcmRangeLo == newPCMRangeLo) {
                if (!ma_dr_flac__seek_to_approximate_flac_frame_to_byte(pFlac, closestSeekOffsetBeforeTargetPCMFrame, closestSeekOffsetBeforeTargetPCMFrame, byteRangeHi, &lastSuccessfulSeekOffset)) {
                    break;
                }
                if (ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames(pFlac, pcmFrameIndex - pFlac->currentPCMFrame)) {
                    return MA_TRUE;
                } else {
                    break;
                }
            }
            pcmRangeLo = newPCMRangeLo;
            pcmRangeHi = newPCMRangeHi;
            if (pcmRangeLo <= pcmFrameIndex && pcmRangeHi >= pcmFrameIndex) {
                if (ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames(pFlac, pcmFrameIndex - pFlac->currentPCMFrame) ) {
                    return MA_TRUE;
                } else {
                    break;
                }
            } else {
                const float approxCompressionRatio = (ma_int64)(lastSuccessfulSeekOffset - pFlac->firstFLACFramePosInBytes) / ((ma_int64)(pcmRangeLo * pFlac->channels * pFlac->bitsPerSample)/8.0f);
                if (pcmRangeLo > pcmFrameIndex) {
                    byteRangeHi = lastSuccessfulSeekOffset;
                    if (byteRangeLo > byteRangeHi) {
                        byteRangeLo = byteRangeHi;
                    }
                    targetByte = byteRangeLo + ((byteRangeHi - byteRangeLo) / 2);
                    if (targetByte < byteRangeLo) {
                        targetByte = byteRangeLo;
                    }
                } else  {
                    if ((pcmFrameIndex - pcmRangeLo) < seekForwardThreshold) {
                        if (ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames(pFlac, pcmFrameIndex - pFlac->currentPCMFrame)) {
                            return MA_TRUE;
                        } else {
                            break;
                        }
                    } else {
                        byteRangeLo = lastSuccessfulSeekOffset;
                        if (byteRangeHi < byteRangeLo) {
                            byteRangeHi = byteRangeLo;
                        }
                        targetByte = lastSuccessfulSeekOffset + (ma_uint64)(((ma_int64)((pcmFrameIndex-pcmRangeLo) * pFlac->channels * pFlac->bitsPerSample)/8.0f) * approxCompressionRatio);
                        if (targetByte > byteRangeHi) {
                            targetByte = byteRangeHi;
                        }
                        if (closestSeekOffsetBeforeTargetPCMFrame < lastSuccessfulSeekOffset) {
                            closestSeekOffsetBeforeTargetPCMFrame = lastSuccessfulSeekOffset;
                        }
                    }
                }
            }
        } else {
            break;
        }
    }
    ma_dr_flac__seek_to_first_frame(pFlac);
    return MA_FALSE;
}